

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O3

void Acec_TreePhases_rec(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vMap,int Node,int fPhase,
                        Vec_Bit_t *vVisit)

{
  int Node_00;
  int *piVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint local_6c;
  
  if (Node == 0) {
    __assert_fail("Node != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecTree.c"
                  ,0x188,
                  "void Acec_TreePhases_rec(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, Vec_Bit_t *)"
                 );
  }
  if ((Node < 0) || (vMap->nSize <= Node)) goto LAB_0068721f;
  uVar5 = vMap->pArray[(uint)Node];
  if (uVar5 != 0xffffffff) {
    if (((int)uVar5 < 0) || (uVar4 = uVar5 * 6 + 4, vAdds->nSize <= (int)uVar4)) {
LAB_0068721f:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    piVar1 = vAdds->pArray;
    if (piVar1[uVar4] != Node) {
      __assert_fail("Node == Vec_IntEntry( vAdds, 6*iBox+4 )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecTree.c"
                    ,0x18c,
                    "void Acec_TreePhases_rec(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, Vec_Bit_t *)"
                   );
    }
    if (vVisit->nSize <= (int)uVar5) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                    ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
    }
    uVar4 = vVisit->pArray[uVar5 >> 5];
    if ((uVar4 >> (uVar5 & 0x1f) & 1) != 0) {
      return;
    }
    uVar2 = uVar5 * 6;
    vVisit->pArray[uVar5 >> 5] = uVar4 | 1 << ((byte)uVar5 & 0x1f);
    if ((vAdds->nSize <= (int)(uVar2 + 3)) || (uVar5 = uVar2 + 5, (uint)vAdds->nSize <= uVar5))
    goto LAB_0068721f;
    uVar4 = piVar1[uVar5];
    uVar6 = uVar4 >> 3 & 1;
    local_6c = fPhase;
    if (piVar1[(ulong)uVar2 + 2] == 0) {
      uVar3 = uVar4 >> 2 & 1;
      local_6c = uVar3 ^ fPhase;
      uVar6 = uVar6 ^ local_6c;
      if (uVar3 == fPhase) {
        local_6c = 0;
      }
      else {
        piVar1[uVar5] = uVar4 | 0x40000;
      }
    }
    lVar7 = 0;
    do {
      if (vAdds->nSize <= (int)(uVar2 + (uint)lVar7)) goto LAB_0068721f;
      Node_00 = vAdds->pArray[(ulong)uVar2 + lVar7];
      if (Node_00 != 0) {
        if (vAdds->nSize <= (int)uVar5) goto LAB_0068721f;
        uVar3 = (uint)(((uint)vAdds->pArray[uVar5] >> ((uint)lVar7 & 0x1f) & 1) != 0);
        uVar4 = uVar3 ^ local_6c;
        uVar6 = uVar6 ^ uVar4;
        Acec_TreePhases_rec(p,vAdds,vMap,Node_00,uVar4,vVisit);
        if (uVar3 != local_6c) {
          if (vAdds->nSize <= (int)uVar5) goto LAB_0068723e;
          vAdds->pArray[uVar5] = vAdds->pArray[uVar5] | 0x10000 << ((byte)lVar7 & 0x1f);
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    if (uVar6 != 0) {
      if (vAdds->nSize <= (int)uVar5) goto LAB_0068723e;
      vAdds->pArray[uVar5] = vAdds->pArray[uVar5] | 0x80000;
    }
    if (local_6c != 0) {
      if (vAdds->nSize <= (int)uVar5) {
LAB_0068723e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      vAdds->pArray[uVar5] = vAdds->pArray[uVar5] | 0x100000;
    }
  }
  return;
}

Assistant:

void Acec_TreePhases_rec( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vMap, int Node, int fPhase, Vec_Bit_t * vVisit )
{
    int k, iBox, iXor, fXorPhase, fPhaseThis;
    assert( Node != 0 );
    iBox = Vec_IntEntry( vMap, Node );
    if ( iBox == -1 )
        return;
    assert( Node == Vec_IntEntry( vAdds, 6*iBox+4 ) );
    if ( Vec_BitEntry(vVisit, iBox) )
        return;
    Vec_BitWriteEntry( vVisit, iBox, 1 );
    iXor = Vec_IntEntry( vAdds, 6*iBox+3 );
    fXorPhase = Acec_SignBit(vAdds, iBox, 3);
    if ( Vec_IntEntry(vAdds, 6*iBox+2) == 0 )
    {
        //fPhaseThis = Acec_SignBit( vAdds, iBox, 2 ) ^ fPhase;
        //fXorPhase ^= fPhaseThis;
        //Acec_SignSetBit2( vAdds, iBox, 2, fPhaseThis ); // complemented HADD -- create const1 input
        fPhase ^= Acec_SignBit( vAdds, iBox, 2 );
        fXorPhase ^= fPhase;
        Acec_SignSetBit2( vAdds, iBox, 2, fPhase ); // complemented HADD -- create const1 input
    }
    for ( k = 0; k < 3; k++ )
    {
        int iObj = Vec_IntEntry( vAdds, 6*iBox+k );
        if ( iObj == 0 )
            continue;
        fPhaseThis = Acec_SignBit(vAdds, iBox, k) ^ fPhase;
        fXorPhase ^= fPhaseThis;
        Acec_TreePhases_rec( p, vAdds, vMap, iObj, fPhaseThis, vVisit );
        Acec_SignSetBit2( vAdds, iBox, k, fPhaseThis );
    }
    Acec_SignSetBit2( vAdds, iBox, 3, fXorPhase );
    Acec_SignSetBit2( vAdds, iBox, 4, fPhase );
}